

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * __thiscall rw::Matrix::rotate(Matrix *this,V3d *axis,float32 angle,CombineOp op)

{
  undefined1 local_a0 [8];
  Matrix rot;
  Matrix tmp;
  CombineOp op_local;
  float32 angle_local;
  V3d *axis_local;
  Matrix *this_local;
  
  makeRotation((Matrix *)local_a0,axis,angle);
  if (op == COMBINEREPLACE) {
    memcpy(this,local_a0,0x40);
  }
  else if (op == COMBINEPRECONCAT) {
    mult((Matrix *)&rot.pos.z,(Matrix *)local_a0,this);
    memcpy(this,&rot.pos.z,0x40);
  }
  else if (op == COMBINEPOSTCONCAT) {
    mult((Matrix *)&rot.pos.z,this,(Matrix *)local_a0);
    memcpy(this,&rot.pos.z,0x40);
  }
  return this;
}

Assistant:

Matrix*
Matrix::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Matrix tmp, rot;
	makeRotation(&rot, axis, angle);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &rot, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &rot);
		*this = tmp;
		break;
	}
	return this;
}